

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

void address_space_stl_le_sparc
               (uc_struct_conflict8 *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  address_space_stl_internal_sparc(uc,as,addr,val,attrs,result,DEVICE_LITTLE_ENDIAN);
  return;
}

Assistant:

void glue(address_space_stl_le, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    glue(address_space_stl_internal, SUFFIX)(uc, ARG1, addr, val, attrs,
                                             result, DEVICE_LITTLE_ENDIAN);
}